

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O0

void ScaleARGBFilterCols_C(uint8_t *dst_argb,uint8_t *src_argb,int dst_width,int x,int dx)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint32_t b_1;
  uint32_t a_1;
  int xf_1;
  int xi_1;
  uint32_t b;
  uint32_t a;
  int xf;
  int xi;
  int j;
  uint32_t *dst;
  uint32_t *src;
  int dx_local;
  int x_local;
  int dst_width_local;
  uint8_t *src_argb_local;
  uint8_t *dst_argb_local;
  
  dst = (uint32_t *)dst_argb;
  x_local = x;
  for (j = 0; iVar4 = x_local >> 0x10, j < dst_width + -1; j = j + 2) {
    uVar3 = x_local >> 9 & 0x7f;
    uVar1 = *(uint *)(src_argb + (long)iVar4 * 4);
    uVar2 = *(uint *)(src_argb + (long)(iVar4 + 1) * 4);
    *dst = ((uVar1 >> 0x18) * (uVar3 ^ 0x7f) + (uVar2 >> 0x18) * uVar3 >> 7) << 0x18 |
           ((uVar1 >> 0x10 & 0xff) * (uVar3 ^ 0x7f) + (uVar2 >> 0x10 & 0xff) * uVar3 >> 7) << 0x10 |
           ((uVar1 >> 8 & 0xff) * (uVar3 ^ 0x7f) + (uVar2 >> 8 & 0xff) * uVar3 >> 7) << 8 |
           (uVar1 & 0xff) * (uVar3 ^ 0x7f) + (uVar2 & 0xff) * uVar3 >> 7;
    iVar4 = dx + x_local;
    uVar3 = iVar4 >> 9 & 0x7f;
    uVar1 = *(uint *)(src_argb + (long)(iVar4 >> 0x10) * 4);
    uVar2 = *(uint *)(src_argb + (long)((iVar4 >> 0x10) + 1) * 4);
    dst[1] = ((uVar1 >> 0x18) * (uVar3 ^ 0x7f) + (uVar2 >> 0x18) * uVar3 >> 7) << 0x18 |
             ((uVar1 >> 0x10 & 0xff) * (uVar3 ^ 0x7f) + (uVar2 >> 0x10 & 0xff) * uVar3 >> 7) << 0x10
             | ((uVar1 >> 8 & 0xff) * (uVar3 ^ 0x7f) + (uVar2 >> 8 & 0xff) * uVar3 >> 7) << 8 |
             (uVar1 & 0xff) * (uVar3 ^ 0x7f) + (uVar2 & 0xff) * uVar3 >> 7;
    x_local = dx + iVar4;
    dst = dst + 2;
  }
  if ((dst_width & 1U) != 0) {
    uVar3 = x_local >> 9 & 0x7f;
    uVar1 = *(uint *)(src_argb + (long)iVar4 * 4);
    uVar2 = *(uint *)(src_argb + (long)(iVar4 + 1) * 4);
    *dst = ((uVar1 >> 0x18) * (uVar3 ^ 0x7f) + (uVar2 >> 0x18) * uVar3 >> 7) << 0x18 |
           ((uVar1 >> 0x10 & 0xff) * (uVar3 ^ 0x7f) + (uVar2 >> 0x10 & 0xff) * uVar3 >> 7) << 0x10 |
           ((uVar1 >> 8 & 0xff) * (uVar3 ^ 0x7f) + (uVar2 >> 8 & 0xff) * uVar3 >> 7) << 8 |
           (uVar1 & 0xff) * (uVar3 ^ 0x7f) + (uVar2 & 0xff) * uVar3 >> 7;
  }
  return;
}

Assistant:

void ScaleARGBFilterCols_C(uint8_t* dst_argb,
                           const uint8_t* src_argb,
                           int dst_width,
                           int x,
                           int dx) {
  const uint32_t* src = (const uint32_t*)(src_argb);
  uint32_t* dst = (uint32_t*)(dst_argb);
  int j;
  for (j = 0; j < dst_width - 1; j += 2) {
    int xi = x >> 16;
    int xf = (x >> 9) & 0x7f;
    uint32_t a = src[xi];
    uint32_t b = src[xi + 1];
    dst[0] = BLENDER(a, b, xf);
    x += dx;
    xi = x >> 16;
    xf = (x >> 9) & 0x7f;
    a = src[xi];
    b = src[xi + 1];
    dst[1] = BLENDER(a, b, xf);
    x += dx;
    dst += 2;
  }
  if (dst_width & 1) {
    int xi = x >> 16;
    int xf = (x >> 9) & 0x7f;
    uint32_t a = src[xi];
    uint32_t b = src[xi + 1];
    dst[0] = BLENDER(a, b, xf);
  }
}